

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

void __thiscall
gl4cts::GLSL420Pack::LineContinuationTest::prepareVertexBuffer
          (LineContinuationTest *this,program *program,buffer *buffer,vertexArray *vao)

{
  GLint GVar1;
  deUint32 dVar2;
  long lVar3;
  TestError *this_00;
  VARIABLE_STORAGE storage;
  sockaddr *__addr;
  int __fd;
  GLchar *in_R8;
  string tex_coord_name;
  GLfloat data [4];
  string local_58;
  undefined1 *local_38;
  undefined1 *puStack_30;
  _Alloc_hider _Var4;
  
  storage = (VARIABLE_STORAGE)m_texture_coordinates_name;
  Utils::getVariableName_abi_cxx11_(&local_58,(Utils *)&DAT_00000001,COMPUTE_SHADER,storage,in_R8);
  _Var4._M_p = local_58._M_dataplus._M_p;
  GVar1 = Utils::program::getAttribLocation(program,local_58._M_dataplus._M_p);
  __fd = (int)_Var4._M_p;
  if (GVar1 != -1) {
    Utils::vertexArray::generate(vao);
    Utils::vertexArray::bind(vao,__fd,__addr,storage);
    Utils::buffer::generate(buffer,0x8892);
    local_38 = &DAT_3f0000003f000000;
    puStack_30 = &DAT_3f0000003f000000;
    Utils::buffer::update(buffer,0x10,&local_38,0x88e4);
    lVar3 = (**(code **)(**(long **)(*(long *)&this->field_0x70 + 8) + 0x18))();
    (**(code **)(lVar3 + 0x19f0))(GVar1,2,0x1406,0,0,0);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"VertexAttribPointer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0xba0);
    (**(code **)(lVar3 + 0x610))(GVar1);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"EnableVertexAttribArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0xba4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Vertex attribute location is invalid",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0xb8d);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void LineContinuationTest::prepareVertexBuffer(const Utils::program& program, Utils::buffer& buffer,
											   Utils::vertexArray& vao)
{
	std::string tex_coord_name = Utils::getVariableName(Utils::VERTEX_SHADER, Utils::INPUT, m_texture_coordinates_name);
	GLint		tex_coord_loc  = program.getAttribLocation(tex_coord_name.c_str());

	if (-1 == tex_coord_loc)
	{
		TCU_FAIL("Vertex attribute location is invalid");
	}

	vao.generate();
	vao.bind();

	buffer.generate(GL_ARRAY_BUFFER);

	GLfloat	data[]	= { 0.5f, 0.5f, 0.5f, 0.5f };
	GLsizeiptr data_size = sizeof(data);

	buffer.update(data_size, data, GL_STATIC_DRAW);

	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up vao */
	gl.vertexAttribPointer(tex_coord_loc, 2 /* size */, GL_FLOAT /* type */, GL_FALSE /* normalized*/, 0 /* stride */,
						   0 /* offset */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttribPointer");

	/* Enable attribute */
	gl.enableVertexAttribArray(tex_coord_loc);
	GLU_EXPECT_NO_ERROR(gl.getError(), "EnableVertexAttribArray");
}